

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O3

void __thiscall
baryonyx::details::ap_pnm_observer::make_observation<float>
          (ap_pnm_observer *this,sparse_matrix<int> *ap,float *P,float *param_3)

{
  uint uVar1;
  rgb rVar2;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  pointer_type puVar3;
  size_t __len;
  ulong __n;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  size_type row;
  string_view format_str;
  format_args args;
  pnm_array local_98;
  undefined1 local_88 [16];
  _Head_base<0UL,_int_*,_false> local_78;
  sparse_matrix<int> *local_60;
  colormap local_58;
  string local_50;
  
  local_58.m_lower = -1.0;
  local_58.m_upper = 1.0;
  uVar1 = this->constraints;
  local_98.m_width = this->variables;
  if (local_98.m_width * uVar1 != 0) {
    __n = (ulong)(local_98.m_width * uVar1 * 3);
    local_98.m_heigth = uVar1;
    local_60 = ap;
    __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)operator_new__(__n);
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
    local_98.m_buffer._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
    if (uVar1 != 0) {
      row = 0;
      do {
        sparse_matrix<int>::row((sparse_matrix<int> *)local_88,(int)local_60);
        for (; local_88._8_8_ != local_88._0_8_; local_88._8_8_ = local_88._8_8_ + 8) {
          puVar3 = pnm_array::operator()(&local_98,row,(long)*(int *)(local_88._8_8_ + 4));
          rVar2 = colormap::operator()(&local_58,P[*(int *)local_88._8_8_]);
          *puVar3 = rVar2.red;
          puVar3[1] = rVar2.green;
          puVar3[2] = rVar2.blue;
        }
        row = row + 1;
      } while (row != (uint)this->constraints);
    }
    local_78._M_head_impl = (int *)(ulong)(uint)this->m_frame;
    this->m_frame = this->m_frame + 1;
    local_88._0_8_ = (this->m_basename)._M_dataplus._M_p;
    local_88._8_8_ = (this->m_basename)._M_string_length;
    format_str.size_ = 0x1d;
    format_str.data_ = (char *)0xb;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_88;
    ::fmt::v7::detail::vformat_abi_cxx11_(&local_50,(detail *)"{}-P-{}.pnm",format_str,args);
    pnm_array::operator()(&local_98,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_98.m_buffer._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      operator_delete__((void *)local_98.m_buffer._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
  }
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& ap,
                          const Float* P,
                          const Float* /*pi*/)
    {
        static_assert(std::is_floating_point<Float>::value);

        colormap cm(-1.0f, 1.0f);
        pnm_array pnm(constraints, variables);
        if (!pnm)
            return;

        pnm.clear();
        for (int k = 0; k != constraints; ++k) {
            auto [it, et] = ap.row(k);

            for (; it != et; ++it) {
                std::uint8_t* pointer = pnm(k, it->column);
                auto color_rgb = cm(P[it->value]);

                pointer[0] = color_rgb.red;
                pointer[1] = color_rgb.green;
                pointer[2] = color_rgb.blue;
            }
        }

        pnm(fmt::format("{}-P-{}.pnm", m_basename, m_frame++));
    }